

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::computeDuObj(HModel *this,int phase)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  double dVar5;
  
  this->objective = 0.0;
  if ((long)this->numTot < 1) {
    dVar5 = 0.0;
  }
  else {
    piVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      if (piVar1[lVar4] != 0) {
        dVar5 = dVar5 + pdVar3[lVar4] * pdVar2[lVar4];
        this->objective = dVar5;
      }
      lVar4 = lVar4 + 1;
    } while (this->numTot != lVar4);
  }
  if (phase != 1) {
    this->objective = dVar5 - this->objOffset;
  }
  return;
}

Assistant:

void HModel::computeDuObj(int phase) {
    objective = 0;
    for (int i = 0; i < numTot; i++)
        if (nonbasicFlag[i]) objective += workValue[i] * workDual[i];
//    double sv_objective = objective;
    if (phase != 1) objective -= objOffset;
//    printf("Phase %1d: sv_objective = %g; objOffset = %g; Objective = %g\n", phase, sv_objective, objOffset, objective);
}